

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O1

REF_STATUS
ref_iso_insert(REF_GRID_conflict *iso_grid_ptr,REF_GRID_conflict ref_grid,REF_DBL *field,
              REF_INT ldim,REF_DBL *in,REF_DBL **out)

{
  int iVar1;
  REF_MPI ref_mpi;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  REF_CELL pRVar4;
  bool bVar5;
  REF_EDGE pRVar6;
  uint uVar7;
  uint uVar8;
  REF_STATUS RVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  bool bVar15;
  int iVar16;
  long lVar17;
  char *pcVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  REF_INT new_cell;
  REF_EDGE ref_edge;
  REF_INT edge1;
  REF_INT edge2;
  REF_INT part;
  REF_INT edge0;
  REF_GLOB global;
  REF_INT new_nodes [27];
  REF_INT nodes [27];
  REF_INT local_1fc;
  REF_GRID_conflict local_1f8;
  char local_1ed;
  REF_INT local_1ec;
  REF_EDGE local_1e8;
  REF_INT *local_1e0;
  REF_DBL *local_1d8;
  REF_GRID_conflict local_1d0;
  REF_DBL *local_1c8;
  uint local_1c0;
  uint local_1bc;
  uint local_1b8 [4];
  uint local_1a8;
  uint local_1a4;
  int local_1a0;
  int local_19c;
  uint local_198;
  uint local_194;
  uint local_190;
  undefined4 local_18c;
  REF_GLOB local_120;
  uint local_118 [28];
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  
  ref_mpi = ref_grid->mpi;
  local_1c8 = in;
  uVar7 = ref_node_synchronize_globals(ref_grid->node);
  if (uVar7 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x9f,
           "ref_iso_insert",(ulong)uVar7,"sync glob");
    return uVar7;
  }
  local_1d8 = field;
  local_1d0 = ref_grid;
  uVar7 = ref_grid_create(iso_grid_ptr,ref_mpi);
  if (uVar7 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0xa1,
           "ref_iso_insert",(ulong)uVar7,"create");
    return uVar7;
  }
  local_1f8 = *iso_grid_ptr;
  uVar7 = ref_node_initialize_n_global(local_1f8->node,0);
  if (uVar7 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0xa3,
           "ref_iso_insert",(ulong)uVar7,"zero glob");
    return uVar7;
  }
  uVar7 = ref_edge_create(&local_1e8,local_1d0);
  pRVar6 = local_1e8;
  if (uVar7 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0xa5,
           "ref_iso_insert",(ulong)uVar7,"create edge");
    return uVar7;
  }
  if ((long)local_1e8->n < 0) {
    uVar7 = 1;
    pcVar18 = "malloc new_node of REF_INT negative";
  }
  else {
    local_1e0 = (REF_INT *)malloc((long)local_1e8->n << 2);
    if (local_1e0 != (REF_INT *)0x0) {
      bVar15 = true;
      uVar7 = 0;
      if (0 < pRVar6->n) {
        lVar12 = 0;
        do {
          local_1e0[lVar12] = -1;
          lVar12 = lVar12 + 1;
        } while (lVar12 < pRVar6->n);
      }
      goto LAB_0017336b;
    }
    uVar7 = 2;
    pcVar18 = "malloc new_node of REF_INT NULL";
  }
  bVar15 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0xa6,
         "ref_iso_insert",pcVar18);
  local_1e0 = (REF_INT *)0x0;
LAB_0017336b:
  uVar8 = uVar7;
  if (bVar15) {
    local_1ec = 0;
    if (0 < local_1e8->n) {
      do {
        iVar16 = local_1e8->e2n[local_1ec * 2];
        iVar1 = local_1e8->e2n[local_1ec * 2 + 1];
        uVar8 = ref_edge_part(local_1e8,local_1ec,&local_19c);
        if (uVar8 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                 0xab,"ref_iso_insert",(ulong)uVar8,"edge part");
          return uVar8;
        }
        if (ref_mpi->id == local_19c) {
          dVar20 = local_1d8[iVar16];
          dVar22 = local_1d8[iVar1];
          dVar23 = dVar20;
          if (dVar20 <= dVar22) {
            dVar23 = dVar22;
          }
          if (0.0 < dVar23) {
            if (dVar22 <= dVar20) {
              dVar20 = dVar22;
            }
            if (dVar20 < 0.0) {
              uVar8 = ref_node_next_global(local_1f8->node,&local_120);
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                       ,0xb0,"ref_iso_insert",(ulong)uVar8,"next global");
                return uVar8;
              }
              uVar8 = ref_node_add(local_1f8->node,local_120,local_1e0 + local_1ec);
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                       ,0xb2,"ref_iso_insert",(ulong)uVar8,"add node");
                return uVar8;
              }
              dVar20 = local_1d8[iVar16];
              dVar23 = -dVar20;
              dVar22 = dVar20;
              if (dVar20 <= dVar23) {
                dVar22 = dVar23;
              }
              dVar21 = (local_1d8[iVar1] - dVar20) * 1e+20;
              if (dVar21 <= -dVar21) {
                dVar21 = -dVar21;
              }
              dVar20 = (double)(~-(ulong)(dVar22 < dVar21) & 0x3fe0000000000000 |
                               (ulong)(dVar23 / (local_1d8[iVar1] - dVar20)) &
                               -(ulong)(dVar22 < dVar21));
              dVar22 = 1.0 - dVar20;
              pRVar2 = local_1d0->node->real;
              lVar12 = (long)(iVar1 * 0xf);
              lVar13 = (long)(iVar16 * 0xf);
              pRVar3 = local_1f8->node->real;
              lVar17 = (long)local_1e0[local_1ec];
              pRVar3[lVar17 * 0xf] = pRVar2[lVar12] * dVar20 + pRVar2[lVar13] * dVar22;
              pRVar3[lVar17 * 0xf + 1] = pRVar2[lVar12 + 1] * dVar20 + pRVar2[lVar13 + 1] * dVar22;
              pRVar3[lVar17 * 0xf + 2] = pRVar2[lVar12 + 2] * dVar20 + dVar22 * pRVar2[lVar13 + 2];
            }
          }
        }
        local_1ec = local_1ec + 1;
      } while (local_1ec < local_1e8->n);
    }
    uVar8 = ref_node_shift_new_globals(local_1f8->node);
    if (uVar8 == 0) {
      uVar8 = ref_iso_ghost(local_1f8,local_1e8,local_1e0);
      if (uVar8 == 0) {
        uVar8 = ref_iso_interp(local_1f8,local_1e8,local_1e0,local_1d8,ldim,local_1c8,out);
        if (uVar8 == 0) {
          if (local_1d0->twod == 0) {
            pRVar4 = local_1d0->cell[8];
            bVar15 = 0 < pRVar4->max;
            if (0 < pRVar4->max) {
              iVar16 = 0;
              uVar8 = uVar7;
              do {
                RVar9 = ref_cell_nodes(pRVar4,iVar16,&local_a8);
                uVar7 = uVar8;
                if (RVar9 == 0) {
                  local_1c8 = (REF_DBL *)CONCAT44(local_1c8._4_4_,iVar16);
                  if (pRVar4->edge_per < 1) {
                    uVar19 = 0;
                  }
                  else {
                    lVar12 = 0;
                    uVar19 = 0;
                    do {
                      lVar13 = (long)pRVar4->size_per * (long)iVar16;
                      uVar7 = ref_edge_with(local_1e8,pRVar4->c2n[pRVar4->e2n[lVar12 * 2] + lVar13],
                                            pRVar4->c2n
                                            [(long)(int)lVar13 + (long)pRVar4->e2n[lVar12 * 2 + 1]],
                                            &local_1ec);
                      if (uVar7 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                               ,0xf5,"ref_iso_insert",(ulong)uVar7,"cell edge");
                        goto LAB_0017405a;
                      }
                      uVar7 = local_1e0[local_1ec];
                      local_1b8[lVar12] = uVar7;
                      if (uVar7 != 0xffffffff) {
                        local_118[(int)uVar19] = uVar7;
                        uVar19 = (ulong)((int)uVar19 + 1);
                      }
                      lVar12 = lVar12 + 1;
                    } while (lVar12 < pRVar4->edge_per);
                  }
                  uVar10 = local_1a8;
                  uVar11 = local_1b8[1];
                  iVar16 = (int)uVar19;
                  if (iVar16 == 0) {
                    uVar7 = uVar8;
                    iVar16 = (int)local_1c8;
                  }
                  else if (iVar16 == 4) {
                    local_1d0 = (REF_GRID_conflict)CONCAT44(local_1d0._4_4_,local_1b8[0]);
                    local_1d8 = (REF_DBL *)CONCAT44(local_1d8._4_4_,local_1a4);
                    bVar5 = false;
                    local_1ed = (local_1b8[0] & local_1a4) != 0xffffffff;
                    if (!(bool)local_1ed) {
                      local_198 = local_1b8[1];
                      local_194 = local_1b8[2];
                      local_190 = local_1a8;
                      local_18c = 1;
                      uVar7 = ref_cell_add(local_1f8->cell[3],(REF_INT *)&local_198,&local_1fc);
                      if (uVar7 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                               ,0x10f,"ref_iso_insert",(ulong)uVar7,"add");
                        break;
                      }
                      local_198 = uVar11;
                      local_194 = uVar10;
                      local_190 = local_1b8[3];
                      local_18c = 1;
                      uVar11 = ref_cell_add(local_1f8->cell[3],(REF_INT *)&local_198,&local_1fc);
                      uVar7 = uVar8;
                      if (uVar11 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                               ,0x115,"ref_iso_insert",(ulong)uVar11,"add");
                        uVar7 = uVar11;
                      }
                      bVar5 = true;
                      uVar8 = uVar7;
                      if (uVar11 != 0) break;
                    }
                    uVar10 = local_1b8[3];
                    uVar11 = local_1b8[2];
                    local_1bc = local_1b8[1];
                    local_1c0 = local_1a8;
                    if ((local_1b8[1] & local_1a8) == 0xffffffff) {
                      if (local_1ed == '\0') {
                        uVar14 = 0x118;
LAB_00174048:
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                               ,uVar14,"ref_iso_insert","found twice");
                        uVar7 = 1;
                      }
                      else {
                        local_198 = (uint)local_1d0;
                        local_194 = local_1b8[3];
                        local_190 = local_1b8[2];
                        local_18c = 1;
                        uVar7 = ref_cell_add(local_1f8->cell[3],(REF_INT *)&local_198,&local_1fc);
                        if (uVar7 == 0) {
                          local_198 = uVar11;
                          local_194 = uVar10;
                          local_190 = (uint)local_1d8;
                          local_18c = 1;
                          uVar11 = ref_cell_add(local_1f8->cell[3],(REF_INT *)&local_198,&local_1fc)
                          ;
                          uVar7 = uVar8;
                          if (uVar11 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                   ,0x125,"ref_iso_insert",(ulong)uVar11,"add");
                            uVar7 = uVar11;
                          }
                          bVar5 = true;
                          uVar8 = uVar7;
                          if (uVar11 == 0) goto LAB_00173e31;
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                 ,0x11f,"ref_iso_insert",(ulong)uVar7,"add");
                        }
                      }
                      break;
                    }
LAB_00173e31:
                    uVar7 = uVar8;
                    if ((local_1b8[2] == 0xffffffff) && (local_1b8[3] == 0xffffffff)) {
                      if (bVar5) {
                        uVar14 = 0x128;
                        goto LAB_00174048;
                      }
                      local_198 = (uint)local_1d0;
                      local_194 = local_1c0;
                      local_190 = local_1bc;
                      local_18c = 1;
                      uVar7 = ref_cell_add(local_1f8->cell[3],(REF_INT *)&local_198,&local_1fc);
                      if (uVar7 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                               ,0x12f,"ref_iso_insert",(ulong)uVar7,"add");
                        break;
                      }
                      local_198 = local_1bc;
                      local_194 = local_1c0;
                      local_190 = (uint)local_1d8;
                      local_18c = 1;
                      uVar11 = ref_cell_add(local_1f8->cell[3],(REF_INT *)&local_198,&local_1fc);
                      uVar7 = uVar8;
                      if (uVar11 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                               ,0x135,"ref_iso_insert",(ulong)uVar11,"add");
                        uVar7 = uVar11;
                      }
                      bVar5 = true;
                      if (uVar11 != 0) break;
                    }
                    iVar16 = (int)local_1c8;
                    if (!bVar5) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                             ,0x137,"ref_iso_insert","not found");
                      uVar7 = 1;
                      break;
                    }
                  }
                  else {
                    if (iVar16 != 3) {
                      printf("nedge %d\n",uVar19);
                      uVar7 = 6;
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                             ,0x13c,"ref_iso_insert",6,"implement iso surface tet intersection");
                      break;
                    }
                    local_118[3] = 1;
                    uVar11 = ref_cell_add(local_1f8->cell[3],(REF_INT *)local_118,&local_1fc);
                    uVar7 = uVar8;
                    if (uVar11 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                             ,0x103,"ref_iso_insert",(ulong)uVar11,"add");
                      uVar7 = uVar11;
                    }
                    iVar16 = (int)local_1c8;
                    if (uVar11 != 0) break;
                  }
                }
                iVar16 = iVar16 + 1;
                bVar15 = iVar16 < pRVar4->max;
                uVar8 = uVar7;
              } while (iVar16 < pRVar4->max);
            }
LAB_0017405a:
            if (bVar15) {
              return uVar7;
            }
          }
          else {
            pRVar4 = local_1d0->cell[3];
            if (0 < pRVar4->max) {
              iVar16 = 0;
              do {
                RVar9 = ref_cell_nodes(pRVar4,iVar16,&local_a8);
                if (RVar9 == 0) {
                  uVar7 = ref_edge_with(local_1e8,local_a4,local_a0,(REF_INT *)&local_198);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                           ,0xd0,"ref_iso_insert",(ulong)uVar7,"e0");
                    return uVar7;
                  }
                  uVar7 = ref_edge_with(local_1e8,local_a0,local_a8,(REF_INT *)local_1b8);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                           ,0xd1,"ref_iso_insert",(ulong)uVar7,"e1");
                    return uVar7;
                  }
                  uVar7 = ref_edge_with(local_1e8,local_a8,local_a4,&local_1a0);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                           ,0xd2,"ref_iso_insert",(ulong)uVar7,"e2");
                    return uVar7;
                  }
                  uVar7 = local_1e0[(int)local_198];
                  uVar8 = local_1e0[(int)local_1b8[0]];
                  uVar11 = local_1e0[local_1a0];
                  if (((uVar7 == 0xffffffff) && (uVar8 != 0xffffffff)) && (uVar11 != 0xffffffff)) {
                    local_118[2] = 1;
                    local_118[0] = uVar8;
                    local_118[1] = uVar11;
                    uVar10 = ref_cell_add(local_1f8->cell[0],(REF_INT *)local_118,&local_1fc);
                    if (uVar10 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                             ,0xda,"ref_iso_insert",(ulong)uVar10,"add");
                      return uVar10;
                    }
                  }
                  if (((uVar7 != 0xffffffff) && (uVar8 == 0xffffffff)) && (uVar11 != 0xffffffff)) {
                    local_118[2] = 1;
                    local_118[0] = uVar11;
                    local_118[1] = uVar7;
                    uVar10 = ref_cell_add(local_1f8->cell[0],(REF_INT *)local_118,&local_1fc);
                    if (uVar10 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                             ,0xe0,"ref_iso_insert",(ulong)uVar10,"add");
                      return uVar10;
                    }
                  }
                  if (((uVar7 != 0xffffffff) && (uVar8 != 0xffffffff)) && (uVar11 == 0xffffffff)) {
                    local_118[2] = 1;
                    local_118[0] = uVar7;
                    local_118[1] = uVar8;
                    uVar7 = ref_cell_add(local_1f8->cell[0],(REF_INT *)local_118,&local_1fc);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                             ,0xe6,"ref_iso_insert",(ulong)uVar7,"add");
                      return uVar7;
                    }
                  }
                }
                iVar16 = iVar16 + 1;
              } while (iVar16 < pRVar4->max);
            }
          }
          if (local_1e0 != (REF_INT *)0x0) {
            free(local_1e0);
          }
          ref_edge_free(local_1e8);
          uVar8 = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                 0xcb,"ref_iso_insert",(ulong)uVar8,"interp in to out");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",200,
               "ref_iso_insert",(ulong)uVar8,"new ghost");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0xc6,
             "ref_iso_insert",(ulong)uVar8,"shift iso glob");
    }
  }
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_iso_insert(REF_GRID *iso_grid_ptr, REF_GRID ref_grid,
                                  REF_DBL *field, REF_INT ldim, REF_DBL *in,
                                  REF_DBL **out) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GRID iso_grid;
  REF_EDGE ref_edge;
  REF_INT *new_node;
  REF_INT edge, part, new_cell;
  REF_INT node0, node1, node2;
  REF_INT edge0, edge1, edge2;
  REF_GLOB global;
  REF_DBL t1, t0, d;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT id = 1;

  RSS(ref_node_synchronize_globals(ref_grid_node(ref_grid)), "sync glob");

  RSS(ref_grid_create(iso_grid_ptr, ref_mpi), "create");
  iso_grid = *iso_grid_ptr;
  RSS(ref_node_initialize_n_global(ref_grid_node(iso_grid), 0), "zero glob");

  RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
  ref_malloc_init(new_node, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);

  each_ref_edge(ref_edge, edge) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (ref_mpi_rank(ref_mpi) == part) {
      if (MAX(field[node0], field[node1]) > 0.0 &&
          MIN(field[node0], field[node1]) < 0.0) {
        RSS(ref_node_next_global(ref_grid_node(iso_grid), &global),
            "next global");
        RSS(ref_node_add(ref_grid_node(iso_grid), global, &(new_node[edge])),
            "add node");
        d = field[node1] - field[node0];
        t1 = 0.5;
        if (ref_math_divisible(field[node0], d)) {
          t1 = -field[node0] / d;
        }
        t0 = 1.0 - t1;
        /*printf("%f %f d %f t %f\n",field[node0],field[node1],d,t);*/
        ref_node_xyz(ref_grid_node(iso_grid), 0, new_node[edge]) =
            t1 * ref_node_xyz(ref_grid_node(ref_grid), 0, node1) +
            t0 * ref_node_xyz(ref_grid_node(ref_grid), 0, node0);
        ref_node_xyz(ref_grid_node(iso_grid), 1, new_node[edge]) =
            t1 * ref_node_xyz(ref_grid_node(ref_grid), 1, node1) +
            t0 * ref_node_xyz(ref_grid_node(ref_grid), 1, node0);
        ref_node_xyz(ref_grid_node(iso_grid), 2, new_node[edge]) =
            t1 * ref_node_xyz(ref_grid_node(ref_grid), 2, node1) +
            t0 * ref_node_xyz(ref_grid_node(ref_grid), 2, node0);
      }
    }
  }
  RSS(ref_node_shift_new_globals(ref_grid_node(iso_grid)), "shift iso glob");

  RSS(ref_iso_ghost(iso_grid, ref_edge, new_node), "new ghost");

  RSS(ref_iso_interp(iso_grid, ref_edge, new_node, field, ldim, in, out),
      "interp in to out");

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge0), "e0");
      RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge1), "e1");
      RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge2), "e2");
      node0 = new_node[edge0];
      node1 = new_node[edge1];
      node2 = new_node[edge2];
      if (REF_EMPTY == node0 && REF_EMPTY != node1 && REF_EMPTY != node2) {
        new_nodes[0] = node1;
        new_nodes[1] = node2;
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
      if (REF_EMPTY != node0 && REF_EMPTY == node1 && REF_EMPTY != node2) {
        new_nodes[0] = node2;
        new_nodes[1] = node0;
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
      if (REF_EMPTY != node0 && REF_EMPTY != node1 && REF_EMPTY == node2) {
        new_nodes[0] = node0;
        new_nodes[1] = node1;
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
    }
  } else {
    REF_INT cell_edge;
    REF_INT edge_nodes[6];
    REF_INT nedge;
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_BOOL found;
    ref_cell = ref_grid_tet(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      nedge = 0;
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        RSS(ref_edge_with(ref_edge, ref_cell_e2n(ref_cell, 0, cell_edge, cell),
                          ref_cell_e2n(ref_cell, 1, cell_edge, cell), &edge),
            "cell edge");
        edge_nodes[cell_edge] = new_node[edge];
        if (REF_EMPTY != edge_nodes[cell_edge]) {
          new_nodes[nedge] = edge_nodes[cell_edge];
          nedge++;
        }
      }
      switch (nedge) {
        case 0:
          /* cell is not intersected by iso surface */
          break;
        case 3:
          new_nodes[3] = id;
          RSS(ref_cell_add(ref_grid_tri(iso_grid), new_nodes, &new_cell),
              "add");
          break;
        case 4:
          found = REF_FALSE;
          if (REF_EMPTY == edge_nodes[0] && REF_EMPTY == edge_nodes[5]) {
            RAS(!found, "found twice");
            found = REF_TRUE;
            tri_nodes[0] = edge_nodes[1];
            tri_nodes[1] = edge_nodes[2];
            tri_nodes[2] = edge_nodes[4];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
            tri_nodes[0] = edge_nodes[1];
            tri_nodes[1] = edge_nodes[4];
            tri_nodes[2] = edge_nodes[3];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
          }
          if (REF_EMPTY == edge_nodes[1] && REF_EMPTY == edge_nodes[4]) {
            RAS(!found, "found twice");
            found = REF_TRUE;
            tri_nodes[0] = edge_nodes[0];
            tri_nodes[1] = edge_nodes[3];
            tri_nodes[2] = edge_nodes[2];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
            tri_nodes[0] = edge_nodes[2];
            tri_nodes[1] = edge_nodes[3];
            tri_nodes[2] = edge_nodes[5];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
          }
          if (REF_EMPTY == edge_nodes[2] && REF_EMPTY == edge_nodes[3]) {
            RAS(!found, "found twice");
            found = REF_TRUE;
            tri_nodes[0] = edge_nodes[0];
            tri_nodes[1] = edge_nodes[4];
            tri_nodes[2] = edge_nodes[1];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
            tri_nodes[0] = edge_nodes[1];
            tri_nodes[1] = edge_nodes[4];
            tri_nodes[2] = edge_nodes[5];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
          }
          RAS(found, "not found");
          break;

        default:
          printf("nedge %d\n", nedge);
          RSS(REF_IMPLEMENT, "implement iso surface tet intersection");
          break;
      }
    }
  }

  ref_free(new_node);
  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}